

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O1

void __thiscall
Diligent::
ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
::SetArray(ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
           *this,IDeviceObject **ppObjects,Uint32 FirstElement,Uint32 NumElements,
          SET_SHADER_RESOURCE_FLAGS Flags)

{
  PipelineResourceDesc *Args;
  ulong uVar1;
  uint *Args_7;
  Uint32 FirstElement_local;
  string msg;
  int local_38;
  int local_34;
  
  Args_7 = (uint *)0x25a042;
  FirstElement_local = FirstElement;
  Args = ShaderVariableManagerVk::GetResourceDesc(this->m_ParentManager,this->m_ResIndex);
  if (Args->ArraySize < FirstElement_local + NumElements) {
    local_34 = (FirstElement_local + NumElements) - 1;
    local_38 = Args->ArraySize - 1;
    FormatString<char[37],char_const*,char[38],unsigned_int,char[5],unsigned_int,char[31],unsigned_int>
              (&msg,(Diligent *)"SetArray arguments are invalid for \'",(char (*) [37])Args,
               (char **)"\' variable: specified element range (",(char (*) [38])&FirstElement_local,
               (uint *)0x6d8549,(char (*) [5])&local_34,(uint *)") is out of array bounds 0 .. ",
               (char (*) [31])&local_38,Args_7);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetArray",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x2ab);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (NumElements != 0) {
    uVar1 = 0;
    do {
      msg._M_string_length._4_4_ = FirstElement_local + (int)uVar1;
      msg._M_dataplus._M_p = (pointer)ppObjects[uVar1];
      msg.field_2._M_allocated_capacity = 0;
      msg.field_2._8_8_ = 0;
      msg._M_string_length._0_4_ = Flags;
      ShaderVariableVkImpl::BindResource((ShaderVariableVkImpl *)this,(BindResourceInfo *)&msg);
      uVar1 = uVar1 + 1;
    } while (NumElements != uVar1);
  }
  return;
}

Assistant:

SetArray(IDeviceObject* const*     ppObjects,
                                             Uint32                    FirstElement,
                                             Uint32                    NumElements,
                                             SET_SHADER_RESOURCE_FLAGS Flags) override final
    {
        const PipelineResourceDesc& Desc = GetDesc();

        DEV_CHECK_ERR(FirstElement + NumElements <= Desc.ArraySize,
                      "SetArray arguments are invalid for '", Desc.Name, "' variable: specified element range (", FirstElement, " .. ",
                      FirstElement + NumElements - 1, ") is out of array bounds 0 .. ", Desc.ArraySize - 1);

        for (Uint32 elem = 0; elem < NumElements; ++elem)
            static_cast<ThisImplType*>(this)->BindResource(BindResourceInfo{FirstElement + elem, ppObjects[elem], Flags});
    }